

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThread.cpp
# Opt level: O0

Value __thiscall xmrig::OclThread::toJSON(OclThread *this,Document *doc)

{
  bool bVar1;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  OclThread *in_RSI;
  char *__s;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RDI;
  GenericStringRef<char> GVar3;
  Value VVar4;
  long thread;
  const_iterator __end1;
  const_iterator __begin1;
  vector<long,_std::allocator<long>_> *__range1;
  Value threads;
  Value si;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *out;
  undefined4 in_stack_fffffffffffffed8;
  Type in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  SizeType in_stack_fffffffffffffee4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffee8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_01;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  StringRefType *in_stack_ffffffffffffff38;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff40;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_a8;
  vector<long,_std::allocator<long>_> *local_a0;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_98 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_78 [5];
  byte local_21;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_20;
  
  this_01 = in_RDI;
  local_20 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  local_21 = 0;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffedc);
  __s = kIndex;
  GVar3 = rapidjson::StringRef<char>
                    ((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  index(in_RSI,__s,GVar3.length);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
             in_stack_ffffffffffffff28);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  intensity(in_RSI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
             in_stack_ffffffffffffff28);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  worksize(in_RSI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
             in_stack_ffffffffffffff28);
  bVar1 = std::bitset<2UL>::test
                    ((bitset<2UL> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (bVar1) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffedc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    Reserve(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
            (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    stridedIndex(in_RSI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this_01,(uint)((ulong)in_RSI >> 0x20),in_RDI);
    memChunk(in_RSI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this_01,(uint)((ulong)in_RSI >> 0x20),in_RDI);
    rapidjson::StringRef<char>
              ((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
              in_stack_ffffffffffffff28);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(local_78);
  }
  this_00 = local_98;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffedc);
  std::vector<long,_std::allocator<long>_>::size(&in_RSI->m_threads);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  Reserve(this_00,in_stack_fffffffffffffee4,
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_a0 = &in_RSI->m_threads;
  local_a8._M_current =
       (long *)std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  std::vector<long,_std::allocator<long>_>::end
            ((vector<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                             *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                             *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)), bVar1
        ) {
    __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::operator*
              (&local_a8);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<long>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)this_01,(long)in_RSI,in_RDI);
    __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
    operator++(&local_a8);
  }
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
            in_stack_ffffffffffffff28);
  bVar1 = std::bitset<2UL>::test
                    ((bitset<2UL> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (!bVar1) {
    rapidjson::StringRef<char>
              ((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    unrollFactor(in_RSI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
               in_stack_ffffffffffffff28);
  }
  local_21 = 1;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(local_98);
  uVar2 = extraout_RDX;
  if ((local_21 & 1) == 0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)this_01);
    uVar2 = extraout_RDX_00;
  }
  VVar4.data_.s.str = (Ch *)uVar2;
  VVar4.data_.n = (Number)in_RDI;
  return (Value)VVar4.data_;
}

Assistant:

rapidjson::Value xmrig::OclThread::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out(kObjectType);

    out.AddMember(StringRef(kIndex),        index(), allocator);
    out.AddMember(StringRef(kIntensity),    intensity(), allocator);
    out.AddMember(StringRef(kWorksize),     worksize(), allocator);

    if (m_fields.test(STRIDED_INDEX_FIELD)) {
        Value si(kArrayType);
        si.Reserve(2, allocator);
        si.PushBack(stridedIndex(), allocator);
        si.PushBack(memChunk(), allocator);
        out.AddMember(StringRef(kStridedIndex), si, allocator);
    }

    Value threads(kArrayType);
    threads.Reserve(m_threads.size(), allocator);

    for (auto thread : m_threads) {
        threads.PushBack(thread, allocator);
    }

    out.AddMember(StringRef(kThreads), threads, allocator);

    if (m_fields.test(RANDOMX_FIELDS)) {
    }
    else {
        out.AddMember(StringRef(kUnroll), unrollFactor(), allocator);
    }

    return out;
}